

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O2

void __thiscall
snestistics::EmulateRegisters::write_word
          (EmulateRegisters *this,uint32_t address,uint16_t v,MemoryAccessType reason)

{
  byte bVar1;
  uint32_t r;
  uint8_t v_00;
  
  r = remap(this,address);
  v_00 = (uint8_t)(v >> 8);
  if ((r & 0xffffff00) == 0x2100) {
    special_write_a(this,r,(uint8_t)v);
    special_write_a(this,r + 1,v_00);
  }
  else {
    if (0x2ff < r - 0x4200) {
      bVar1 = 0;
      goto LAB_00134724;
    }
    special_write_b(this,r,(uint8_t)v);
    special_write_b(this,r + 1,v_00);
  }
  bVar1 = 1;
LAB_00134724:
  if (this->_write_function != (memoryAccessFunc)0x0) {
    (*this->_write_function)(this->_callback_context,address,r,(uint32_t)v,2,reason);
  }
  if (!(bool)((r & 0xfe0000) != 0x7e0000 & (bVar1 ^ 1))) {
    *(uint16_t *)(this->_memory + r) = v;
  }
  return;
}

Assistant:

inline void write_word(uint32_t address, uint16_t v, MemoryAccessType reason) {
		uint32_t r = remap(address);

		bool sw = false;

		if (r >= 0x002100 && r <= 0x0021FF) {
			special_write_a(r, v&0xFF);
			special_write_a((r+1)&0xFFFF, v>>8);
			sw = true;
		} else if (r >= 0x004200 && r <= 0x0044ff) {
			special_write_b(r, v&0xFF);
			special_write_b((r+1), (v>>8)&0xFF);
			sw = true;
		}

		if(_write_function)
			(*_write_function)(_callback_context, address, r, v, 2, reason);

		// Don't allow writing to memory mapped registers, SRAM etc...
		// NOTE: Remap remaps to 7E when needed
		uint8_t bank = r>>16;
		if (bank != 0x7E && bank != 0x7F && !sw)
			return;

		*((uint16_t*)&(_memory[r])) = v;
	}